

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcStair::~IfcStair(IfcStair *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)this = 0x836cf0;
  *(undefined8 *)&this->field_0x178 = 0x836e08;
  *(undefined8 *)&this->field_0x88 = 0x836d18;
  *(undefined8 *)&this->field_0x98 = 0x836d40;
  *(undefined8 *)&this->field_0xd0 = 0x836d68;
  *(undefined8 *)&this->field_0x100 = 0x836d90;
  *(undefined8 *)&this->field_0x138 = 0x836db8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStair,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x836de0;
  puVar2 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStair,_1UL>).field_0x10;
  puVar1 = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStair,_1UL>).field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)this,&PTR_construction_vtable_24__00836e28);
  operator_delete(this,400);
  return;
}

Assistant:

IfcStair() : Object("IfcStair") {}